

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<unsigned_long,_false> __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
::
linear_search<int,absl::lts_20250127::container_internal::key_compare_adapter<std::less<int>,int>::checked_compare>
          (btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
           *this,int *k,checked_compare *comp)

{
  field_type fVar1;
  field_type fVar2;
  SearchResult<unsigned_long,_false> SVar3;
  checked_compare *comp_local;
  int *k_local;
  btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
  *this_local;
  
  fVar1 = btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
          ::start((btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                   *)this);
  fVar2 = btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
          ::finish((btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                    *)this);
  SVar3 = linear_search_impl<int,absl::lts_20250127::container_internal::key_compare_adapter<std::less<int>,int>::checked_compare>
                    (this,k,fVar1,fVar2,comp);
  return (SearchResult<unsigned_long,_false>)SVar3.value;
}

Assistant:

SearchResult<size_type, btree_is_key_compare_to<Compare, key_type>::value>
  linear_search(const K &k, const Compare &comp) const {
    return linear_search_impl(k, start(), finish(), comp,
                              btree_is_key_compare_to<Compare, key_type>());
  }